

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_trinary_func_op_bitextract
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op,BaseType expected_result_type,BaseType input_type0,
          BaseType input_type1,BaseType input_type2)

{
  BaseType BVar1;
  bool bVar2;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  undefined4 in_register_0000008c;
  char (*ts_7) [2];
  char (*pacVar5) [2];
  string local_2a0;
  string expr;
  string cast_op2;
  string cast_op1;
  string op2_expr;
  string op1_expr;
  string cast_op0;
  string local_1c0;
  string local_1a0;
  SPIRType expected_type;
  
  BVar1 = input_type0;
  pacVar5 = (char (*) [2])CONCAT44(in_register_0000008c,op2);
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  SPIRType::SPIRType(&expected_type,pSVar3);
  expected_type.super_IVariant._12_4_ = BVar1;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op0);
  if (*(BaseType *)&(pSVar4->super_IVariant).field_0xc == BVar1) {
    to_unpacked_expression_abi_cxx11_(&cast_op0,this,op0,true);
  }
  else {
    bitcast_glsl_abi_cxx11_(&cast_op0,this,&expected_type,op0);
  }
  to_unpacked_expression_abi_cxx11_(&op1_expr,this,op1,true);
  to_unpacked_expression_abi_cxx11_(&op2_expr,this,op2,true);
  BVar1 = input_type1;
  expected_type.super_IVariant._12_4_ = input_type1;
  expected_type.vecsize = 1;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op1);
  if (*(BaseType *)&(pSVar4->super_IVariant).field_0xc == BVar1) {
    cast_op1._M_dataplus._M_p = (pointer)&cast_op1.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&cast_op1,op1_expr._M_dataplus._M_p,
               op1_expr._M_dataplus._M_p + op1_expr._M_string_length);
    BVar1 = input_type2;
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&local_1a0,this,&expected_type);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&cast_op1,(spirv_cross *)&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f5ef,
               (char (*) [2])&op1_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,pacVar5
              );
    BVar1 = input_type2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
  }
  expected_type.vecsize = 1;
  expected_type.super_IVariant._12_4_ = BVar1;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op2);
  if (*(BaseType *)&(pSVar4->super_IVariant).field_0xc == BVar1) {
    cast_op2._M_dataplus._M_p = (pointer)&cast_op2.field_2;
    ts_7 = (char (*) [2])0x1f079d;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&cast_op2,op2_expr._M_dataplus._M_p,
               op2_expr._M_dataplus._M_p + op2_expr._M_string_length);
    BVar1 = expected_result_type;
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&local_1c0,this,&expected_type);
    ts_7 = (char (*) [2])0x1f0775;
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&cast_op2,(spirv_cross *)&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f5ef,
               (char (*) [2])&op2_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,pacVar5
              );
    BVar1 = expected_result_type;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      ts_7 = (char (*) [2])0x1f07bf;
      operator_delete(local_1c0._M_dataplus._M_p);
    }
  }
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  if (*(BaseType *)&(pSVar3->super_IVariant).field_0xc == BVar1) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_2a0,(spirv_cross *)&op,(char **)0x35f5ef,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f4cc,
               (char (*) [3])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f4cc,
               (char (*) [3])&cast_op2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,ts_7);
    ::std::__cxx11::string::_M_append((char *)&expr,(ulong)local_2a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
  }
  else {
    expected_type.vecsize = pSVar3->vecsize;
    expected_type.super_IVariant._12_4_ = BVar1;
    (*(this->super_Compiler)._vptr_Compiler[0x38])(&local_2a0,this,pSVar3);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    pacVar5 = (char (*) [2])0x1f08b6;
    ::std::__cxx11::string::push_back((char)&expr);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_2a0,(spirv_cross *)&op,(char **)0x35f5ef,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f4cc,
               (char (*) [3])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f4cc,
               (char (*) [3])&cast_op2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,pacVar5
              );
    ::std::__cxx11::string::_M_append((char *)&expr,(ulong)local_2a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back((char)&expr);
  }
  bVar2 = should_forward(this,op0);
  if ((bVar2) && (bVar2 = should_forward(this,op1), bVar2)) {
    bVar2 = should_forward(this,op2);
  }
  else {
    bVar2 = false;
  }
  emit_op(this,result_type,result_id,&expr,bVar2,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
    operator_delete(expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cast_op2._M_dataplus._M_p != &cast_op2.field_2) {
    operator_delete(cast_op2._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cast_op1._M_dataplus._M_p != &cast_op1.field_2) {
    operator_delete(cast_op1._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op2_expr._M_dataplus._M_p != &op2_expr.field_2) {
    operator_delete(op2_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op1_expr._M_dataplus._M_p != &op1_expr.field_2) {
    operator_delete(op1_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cast_op0._M_dataplus._M_p != &cast_op0.field_2) {
    operator_delete(cast_op0._M_dataplus._M_p);
  }
  expected_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d8230;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&expected_type.member_name_cache._M_h);
  expected_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      expected_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &expected_type.member_type_index_redirection.stack_storage) {
    free(expected_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  expected_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      expected_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
      != &expected_type.member_types.stack_storage) {
    free(expected_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
         ptr);
  }
  expected_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)expected_type.array_size_literal.super_VectorView<bool>.ptr !=
      &expected_type.array_size_literal.stack_storage) {
    free(expected_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  expected_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)expected_type.array.super_VectorView<unsigned_int>.ptr !=
      &expected_type.array.stack_storage) {
    free(expected_type.array.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_trinary_func_op_bitextract(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                                   uint32_t op2, const char *op,
                                                   SPIRType::BaseType expected_result_type,
                                                   SPIRType::BaseType input_type0, SPIRType::BaseType input_type1,
                                                   SPIRType::BaseType input_type2)
{
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type0;

	string cast_op0 =
	    expression_type(op0).basetype != input_type0 ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);

	auto op1_expr = to_unpacked_expression(op1);
	auto op2_expr = to_unpacked_expression(op2);

	// Use value casts here instead. Input must be exactly int or uint, but SPIR-V might be 16-bit.
	expected_type.basetype = input_type1;
	expected_type.vecsize = 1;
	string cast_op1 = expression_type(op1).basetype != input_type1 ?
	                      join(type_to_glsl_constructor(expected_type), "(", op1_expr, ")") :
	                      op1_expr;

	expected_type.basetype = input_type2;
	expected_type.vecsize = 1;
	string cast_op2 = expression_type(op2).basetype != input_type2 ?
	                      join(type_to_glsl_constructor(expected_type), "(", op2_expr, ")") :
	                      op2_expr;

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.vecsize = out_type.vecsize;
		expected_type.basetype = expected_result_type;
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1) && should_forward(op2));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
}